

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  PositionType *pPVar1;
  cmMakefile *this;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  cmGlobalGenerator *this_00;
  cmValue cVar5;
  LinkClosure *pLVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmComputeLinkInformation *cli;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar8;
  char *extraout_RDX_01;
  cmLinkLineComputer *this_01;
  string_view value;
  string_view value_00;
  cmLinkLineDeviceComputer deviceLinkComputer;
  cmLinkLineComputer local_b0;
  cmStateSnapshot local_70;
  cmStateDirectory local_58;
  
  this_00 = cmGeneratorTarget::GetGlobalGenerator(target);
  pPVar1 = &local_b0.StateDir.DirectoryState.Position;
  local_b0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CUDA","");
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,(string *)&local_b0);
  if (local_b0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(local_b0._vptr_cmLinkLineComputer,local_b0.StateDir.DirectoryState.Position + 1)
    ;
  }
  if ((bVar2) && (TVar4 = cmGeneratorTarget::GetType(target), TVar4 != OBJECT_LIBRARY)) {
    this = lg->Makefile;
    local_b0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE","");
    bVar2 = cmMakefile::IsOn(this,(string *)&local_b0);
    if (local_b0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
      operator_delete(local_b0._vptr_cmLinkLineComputer,
                      local_b0.StateDir.DirectoryState.Position + 1);
    }
    if (bVar2) {
      local_b0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
      cVar5 = cmGeneratorTarget::GetProperty(target,(string *)&local_b0);
      pcVar8 = extraout_RDX;
      if (local_b0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(local_b0._vptr_cmLinkLineComputer,
                        local_b0.StateDir.DirectoryState.Position + 1);
        pcVar8 = extraout_RDX_00;
      }
      if (cVar5.Value != (string *)0x0) {
        value._M_str = pcVar8;
        value._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
        bVar3 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value);
        goto LAB_004facb3;
      }
      pLVar6 = cmGeneratorTarget::GetLinkClosure(target,config);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                        ((pLVar6->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pLVar6->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,"CUDA");
      if (_Var7._M_current !=
          (pLVar6->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_b0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"CUDA_SEPARABLE_COMPILATION","");
        cVar5 = cmGeneratorTarget::GetProperty(target,(string *)&local_b0);
        if (cVar5.Value == (string *)0x0) {
          bVar2 = false;
        }
        else {
          value_00._M_str = extraout_RDX_01;
          value_00._M_len = (size_t)((cVar5.Value)->_M_dataplus)._M_p;
          bVar2 = cmValue::IsOn((cmValue *)(cVar5.Value)->_M_string_length,value_00);
        }
        if (local_b0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
          operator_delete(local_b0._vptr_cmLinkLineComputer,
                          local_b0.StateDir.DirectoryState.Position + 1);
        }
        if (bVar2 == false) {
          cli = cmGeneratorTarget::GetLinkInformation(target,config);
          if (cli == (cmComputeLinkInformation *)0x0) {
            bVar3 = 1;
          }
          else {
            cmLocalGenerator::GetStateSnapshot(&local_70,lg);
            cmStateSnapshot::GetDirectory(&local_58,&local_70);
            this_01 = &local_b0;
            cmLinkLineComputer::cmLinkLineComputer(this_01,&lg->super_cmOutputConverter,&local_58);
            local_b0._vptr_cmLinkLineComputer =
                 (_func_int **)&PTR__cmLinkLineDeviceComputer_00968478;
            bVar3 = cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                              ((cmLinkLineDeviceComputer *)this_01,cli);
            cmLinkLineComputer::~cmLinkLineComputer(&local_b0);
          }
          goto LAB_004facb3;
        }
        TVar4 = cmGeneratorTarget::GetType(target);
        if (TVar4 < OBJECT_LIBRARY) {
          bVar3 = 0xd >> ((byte)TVar4 & 0xf);
          goto LAB_004facb3;
        }
      }
    }
  }
  bVar3 = 0;
LAB_004facb3:
  return (bool)(bVar3 & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (!lg.GetMakefile()->IsOn("CMAKE_CUDA_COMPILER_HAS_DEVICE_LINK_PHASE")) {
    return false;
  }

  if (cmValue resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmIsOn(*resolveDeviceSymbols);
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  if (cm::contains(closure->Languages, "CUDA")) {
    if (cmIsOn(target.GetProperty("CUDA_SEPARABLE_COMPILATION"))) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }

    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}